

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O3

int __thiscall E64::blitter_ic::terminal_putchar(blitter_ic *this,uint8_t number,int character)

{
  blit_t *pbVar1;
  uint uVar2;
  short sVar3;
  ulong uVar4;
  ushort uVar5;
  
  if ((char)character == '\r') {
    pbVar1 = this->blit;
    uVar4 = (ulong)((uint)number * 0x140);
    *(short *)(pbVar1->command_buffer + (uVar4 - 0xd)) =
         (short)*(uint *)(pbVar1->command_buffer + (uVar4 - 0xd)) -
         (short)((*(uint *)(pbVar1->command_buffer + (uVar4 - 0xd)) & 0xffff) %
                (uint)(byte)pbVar1->command_buffer[uVar4 - 0x41]);
  }
  else if ((character & 0xffU) == 10) {
    pbVar1 = this->blit;
    uVar4 = (ulong)((uint)number * 0x140);
    uVar5 = (ushort)(byte)pbVar1->command_buffer[uVar4 - 0x41];
    uVar2 = *(uint *)(pbVar1->command_buffer + (uVar4 - 0xd)) & 0xffff;
    sVar3 = (short)*(uint *)(pbVar1->command_buffer + (uVar4 - 0xd)) - (short)(uVar2 % (uint)uVar5);
    *(short *)(pbVar1->command_buffer + (uVar4 - 0xd)) = sVar3;
    if ((byte)pbVar1->command_buffer[uVar4 - 0x3f] - 1 == uVar2 / uVar5) {
      terminal_add_bottom_row(this,number);
    }
    else {
      *(ushort *)(pbVar1->command_buffer + (uVar4 - 0xd)) = uVar5 + sVar3;
    }
  }
  else if ((character & 0xffU) == 9) {
    uVar4 = (ulong)((uint)number * 0x140);
    if ((*(ushort *)(this->blit->command_buffer + (uVar4 - 0xd)) %
         (ushort)(byte)this->blit->command_buffer[uVar4 - 0x41] & 3) != 0) {
      uVar4 = (ulong)((uint)number * 0x140);
      do {
        terminal_putsymbol(this,number,' ');
      } while ((*(ushort *)(this->blit->command_buffer + (uVar4 - 0xd)) %
                (ushort)(byte)this->blit->command_buffer[uVar4 - 0x41] & 3) != 0);
    }
  }
  else {
    terminal_putsymbol(this,number,(char)character);
  }
  return character & 0xff;
}

Assistant:

int E64::blitter_ic::terminal_putchar(uint8_t number, int character)
{
	uint8_t result = (uint8_t)character;
	switch (result) {
		case '\r':
			blit[number].cursor_position -= blit[number].cursor_position % blit[number].get_columns();
			break;
		case '\n':
			blit[number].cursor_position -= blit[number].cursor_position % blit[number].get_columns();
			if ((blit[number].cursor_position / blit[number].get_columns()) == (blit[number].get_rows() - 1)) {
				terminal_add_bottom_row(number);
			} else {
				blit[number].cursor_position += blit[number].get_columns();
			}
			break;
		case '\t':
			while ((blit[number].cursor_position % blit[number].get_columns()) & 0b11) {
				terminal_putsymbol(number, ' ');
			}
			break;
		default:
			terminal_putsymbol(number, result);
			break;
	}
	return result;
}